

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_3b8 [8];
  Configurable config;
  int res;
  char **argv_local;
  int argc_local;
  
  memset(local_3b8,0,0x398);
  config.writeenv = stderr;
  config._601_7_ = stderr_1;
  main_checkfds();
  config.metalinkfile_last._4_4_ = operate((Configurable *)local_3b8,argc,argv);
  free_config_fields((Configurable *)local_3b8);
  return config.metalinkfile_last._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  int res;
  struct Configurable config;

  memset(&config, 0, sizeof(struct Configurable));

  config.errors = stderr; /* default errors to stderr */

  main_checkfds();

  res = operate(&config, argc, argv);

#ifdef __SYMBIAN32__
  if(config.showerror)
    tool_pressanykey();
#endif

  free_config_fields(&config);

#ifdef __NOVELL_LIBC__
  if(getenv("_IN_NETWARE_BASH_") == NULL)
    tool_pressanykey();
#endif

#ifdef __VMS
  vms_special_exit(res, vms_show);
#else
  return res;
#endif
}